

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

void positionDequeFindAdjacentTS
               (double ts,dequePositionTy *l,positionTy **pBefore,positionTy **pAfter)

{
  positionTy *ppVar1;
  positionTy *ppVar2;
  _Map_pointer pppVar3;
  positionTy *ppVar4;
  
  *pAfter = (positionTy *)0x0;
  *pBefore = (positionTy *)0x0;
  ppVar2 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppVar4 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last;
  pppVar3 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  ppVar1 = (l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while( true ) {
    if (ppVar2 == ppVar1) {
      return;
    }
    if (ts < ppVar2->_ts) break;
    *pBefore = ppVar2;
    ppVar2 = ppVar2 + 1;
    if (ppVar2 == ppVar4) {
      ppVar2 = pppVar3[1];
      pppVar3 = pppVar3 + 1;
      ppVar4 = ppVar2 + 7;
    }
  }
  *pAfter = ppVar2;
  return;
}

Assistant:

void positionDequeFindAdjacentTS (double ts, dequePositionTy& l,
                                  positionTy*& pBefore, positionTy*& pAfter)
{
    // init
    pBefore = pAfter = nullptr;
    
    // loop
    for (positionTy& p: l) {
        if (p.ts() <= ts)
            pBefore = &p;           // while less than timestamp keep pBefore updated
        else {
            pAfter = &p;            // now found (first) position greater then ts
            return;                 // short-cut...ts in l would only further increase
        }
    }
}